

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetFrameTimestampsTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::anon_unknown_1::GetFrameTimestampsTests::init
          (GetFrameTimestampsTests *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  int extraout_EAX;
  SimpleConfigCase *this_00;
  pointer filters;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  allocator<char> local_89;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> local_88;
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  local_68;
  string local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<((FilterList *)&local_68,isWindow);
  local_88.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_88,(FilterList *)&local_68);
  for (filters = local_88.
                 super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      filters !=
      local_88.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
    this_00 = (SimpleConfigCase *)operator_new(0x130);
    SimpleConfigCase::SimpleConfigCase
              (this_00,(this->super_TestCaseGroup).m_eglTestCtx,(filters->m_name)._M_dataplus._M_p,
               (filters->m_description)._M_dataplus._M_p,&filters->super_FilterList);
    (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__GetFrameTimestampTest_01e0c500;
    this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0
    ;
    this_00[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    this_00[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    log = ((this_00->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_89);
    tcu::ResultCollector::ResultCollector
              ((ResultCollector *)
               ((long)&this_00[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8),
               log,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_88);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base(&local_68);
  return extraout_EAX;
}

Assistant:

void GetFrameTimestampsTests::init (void)
{
	eglu::FilterList baseFilters;
	baseFilters << isWindow;

	vector<NamedFilterList> filterLists;
	getDefaultFilterLists(filterLists, baseFilters);

	for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
		addChild(new GetFrameTimestampTest(m_eglTestCtx, *i));
}